

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

_Bool roaring64_iterator_advance(roaring64_iterator_t *it)

{
  ulong uVar1;
  _Bool _Var2;
  roaring64_iterator_t *in_RDI;
  uint16_t low16;
  leaf_t *leaf;
  uint8_t in_stack_00000027;
  container_t *in_stack_00000028;
  _Bool in_stack_00000067;
  roaring64_iterator_t *in_stack_00000068;
  roaring64_bitmap_t *in_stack_00000070;
  _Bool local_1;
  
  if ((in_RDI->art_it).value == (art_val_t *)0x0) {
    if ((in_RDI->saturated_forward & 1U) == 0) {
      roaring64_iterator_init_at(in_stack_00000070,in_stack_00000068,in_stack_00000067);
      local_1 = (_Bool)(in_RDI->has_value & 1);
    }
    else {
      in_RDI->has_value = false;
      local_1 = false;
    }
  }
  else {
    uVar1 = in_RDI->value;
    _Var2 = container_iterator_next
                      (in_stack_00000028,in_stack_00000027,(roaring_container_iterator_t *)it,
                       (uint16_t *)leaf);
    if (_Var2) {
      in_RDI->value = in_RDI->high48 | uVar1 & 0xffff;
      in_RDI->has_value = true;
      local_1 = true;
    }
    else {
      _Var2 = art_iterator_next((art_iterator_t *)0x10bca6);
      if (_Var2) {
        local_1 = roaring64_iterator_init_at_leaf_first(in_RDI);
      }
      else {
        in_RDI->saturated_forward = true;
        in_RDI->has_value = false;
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool roaring64_iterator_advance(roaring64_iterator_t *it) {
    if (it->art_it.value == NULL) {
        if (it->saturated_forward) {
            return (it->has_value = false);
        }
        roaring64_iterator_init_at(it->parent, it, /*first=*/true);
        return it->has_value;
    }
    leaf_t *leaf = (leaf_t *)it->art_it.value;
    uint16_t low16 = (uint16_t)it->value;
    if (container_iterator_next(leaf->container, leaf->typecode,
                                &it->container_it, &low16)) {
        it->value = it->high48 | low16;
        return (it->has_value = true);
    }
    if (art_iterator_next(&it->art_it)) {
        return roaring64_iterator_init_at_leaf_first(it);
    }
    it->saturated_forward = true;
    return (it->has_value = false);
}